

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O1

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,FieldAccess *field_access)

{
  pointer pcVar1;
  int index;
  Value *pVVar2;
  string local_60;
  Symbol local_40;
  
  pcVar1 = (field_access->field_name_)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (field_access->field_name_)._M_string_length);
  Symbol::Symbol(&local_40,&local_60);
  index = FunctionTable::Get(&this->table_,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name_._M_dataplus._M_p != &local_40.name_.field_2) {
    operator_delete(local_40.name_._M_dataplus._M_p,local_40.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pVVar2 = FrameEmulator::Get(&this->frame_,index);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar2;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(FieldAccess* field_access) {
  int index = table_.Get(Symbol(field_access->field_name_));
  tos_value_ = frame_.Get(index);
}